

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

png_uint_32 reread_4(file *file)

{
  byte bVar1;
  png_uint_32 pVar2;
  int iVar3;
  bool bVar4;
  
  pVar2 = 0;
  iVar3 = 4;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    bVar1 = reread_byte(file);
    pVar2 = pVar2 << 8 | (uint)bVar1;
  }
  return pVar2;
}

Assistant:

static png_uint_32
reread_4(struct file *file)
   /* The same but for a four byte quantity */
{
   png_uint_32 result = 0;
   int i = 0;

   while (++i <= 4)
      result = (result << 8) + reread_byte(file);

   return result;
}